

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O2

sexp_conflict
sexp_bytevector_u32_set_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg1,sexp_conflict arg2,
          sexp_conflict arg3,sexp_conflict arg4)

{
  uint uVar1;
  sexp_conflict psVar2;
  sexp psVar3;
  uint uVar4;
  
  if ((((ulong)arg1 & 3) != 0) || (arg1->tag != 8)) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,8);
    return psVar2;
  }
  if ((((ulong)arg2 & 1) == 0) && ((((ulong)arg2 & 2) != 0 || (arg2->tag != 0xc)))) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg2);
    return psVar2;
  }
  if ((((ulong)arg3 & 1) == 0) && ((((ulong)arg3 & 2) != 0 || (arg3->tag != 0xc)))) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg3);
    return psVar2;
  }
  if (((ulong)arg2 & 1) != 0) {
    if (((long)arg2 < 0) || (psVar3 = (sexp)((long)arg2 >> 1), (arg1->value).type.name <= psVar3))
    goto LAB_00103213;
    goto LAB_00103232;
  }
  if (((ulong)arg2 & 2) == 0) {
    if (arg2->tag == 0xc) {
      if ((long)(arg2->value).flonum_bits[0] * (arg2->value).uvector.length < 0) goto LAB_00103213;
      if (arg2->tag != 0xc) goto LAB_001031f3;
      psVar3 = (sexp)((long)(arg2->value).flonum_bits[0] * (arg2->value).uvector.length);
    }
    else {
LAB_001031f3:
      psVar3 = (sexp)0x0;
    }
    if ((arg1->value).type.name <= psVar3) {
LAB_00103213:
      psVar2 = (sexp_conflict)
               sexp_user_exception_ls
                         (ctx,self,"assertion failed: (< -1 arg2 (bytevector-length arg1))",2,
                          (char)arg2,(arg1->value).stack.length * 2 + 1);
      return psVar2;
    }
    if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
      psVar3 = (sexp)((long)(arg2->value).flonum_bits[0] * (arg2->value).uvector.length);
      goto LAB_00103232;
    }
  }
  else if ((arg1->value).type.name == (sexp)0x0) goto LAB_00103213;
  psVar3 = (sexp)0x0;
LAB_00103232:
  if (((ulong)arg3 & 1) == 0) {
    if ((((ulong)arg3 & 2) == 0) && (arg3->tag == 0xc)) {
      uVar4 = (int)(arg3->value).flonum_bits[0] * (int)(arg3->value).uvector.length;
    }
    else {
      uVar4 = 0;
    }
  }
  else {
    uVar4 = (uint)((long)arg3 >> 1);
  }
  uVar1 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  if ((((ctx->value).type.setters)->value).type.slots == arg4) {
    uVar1 = uVar4;
  }
  *(uint *)((long)&arg1->value + (long)(int)psVar3 + 8) = uVar1;
  return (sexp_conflict)0x43e;
}

Assistant:

sexp sexp_bytevector_u32_set_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg1, sexp arg2, sexp arg3, sexp arg4) {
  sexp res;
  if (! sexp_bytesp(arg1))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  if (! sexp_exact_integerp(arg3))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg3);
  if (!((-1 < sexp_sint_value(arg2)) && (sexp_sint_value(arg2) < sexp_bytes_length(arg1)))) {
    return sexp_user_exception_ls(ctx, self, "assertion failed: " "(< -1 arg2 (bytevector-length arg1))", 2, arg2, sexp_make_fixnum(sexp_bytes_length(arg1)));
  }
  res = ((bytevector_u32_set_x(ctx, sexp_bytes_data(arg1), sexp_sint_value(arg2), sexp_sint_value(arg3), arg4)), SEXP_VOID);
  return res;
}